

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

int __thiscall crypto::xchacha20::init(xchacha20 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  char *unaff_retaddr;
  char subkey [32];
  char *in_stack_ffffffffffffffb8;
  
  derive_subkey(unaff_retaddr,(char *)this,(char *)ctx);
  init_state(this->state,in_stack_ffffffffffffffb8);
  this->state[0xc] = 0;
  this->state[0xd] = 0;
  uVar1 = util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffffb8);
  this->state[0xe] = uVar1;
  uVar1 = util::endianness<util::little_endian>::load<unsigned_int>(in_stack_ffffffffffffffb8);
  this->state[0xf] = uVar1;
  this->pos = '@';
  return (int)this;
}

Assistant:

void xchacha20::init(const char key[key_size], const char nonce[nonce_size]) {
	
	char subkey[key_size];
	derive_subkey(key, nonce, subkey);
	init_state(state, subkey);
	state[12] = 0;
	state[13] = 0;
	state[14] = util::little_endian::load<word>(nonce + 16);
	state[15] = util::little_endian::load<word>(nonce + 20);
	pos = sizeof(keystream);
	
}